

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pdVar1;
  pointer ppVar2;
  element_type *peVar3;
  bool bVar4;
  path *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  ostream *poVar7;
  reference pvVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  difference_type __d;
  ulong uVar12;
  path *d;
  pointer __p;
  pointer pdVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<double,_std::allocator<double>_> v;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  string output_dir;
  string mkdir_command;
  vector<double,_std::allocator<double>_> v2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_490;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_478;
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  local_468;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_458;
  ofstream output_file;
  ifstream f;
  
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output_dir._M_dataplus._M_p = getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&f,(char **)&output_dir,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&output_file,(path *)&f);
  std::filesystem::__cxx11::path::~path((path *)&f);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_478,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&output_file);
  output_dir._M_dataplus._M_p = (pointer)local_478._M_ptr;
  output_dir._M_string_length = (size_type)local_478._M_refcount._M_pi;
  local_478._M_ptr = (element_type *)0x0;
  local_478._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_478);
  std::
  __shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_468,
                 (__shared_ptr<std::filesystem::__cxx11::recursive_directory_iterator::_Dir_stack,_(__gnu_cxx::_Lock_policy)2>
                  *)&output_file);
  mkdir_command._M_dataplus._M_p = (pointer)0x0;
  mkdir_command._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_468);
  while (output_dir._M_string_length != mkdir_command._M_string_length) {
    this = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                             ((recursive_directory_iterator *)&output_dir);
    std::filesystem::__cxx11::path::string((string *)&f,this);
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                      "_rse_workshop.dat");
    std::__cxx11::string::~string((string *)&f);
    if (bVar4) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&data_files,this);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&output_dir);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&mkdir_command);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&output_dir);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&output_file);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start,
             data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  ppVar2 = data_files.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__p = data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start; __p != ppVar2; __p = __p + 1) {
    pbVar5 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,__p);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar5);
  }
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&f,
             data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start,_S_in);
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_490,(istream_type *)&f);
  local_458._M_stream = (istream_type *)0x0;
  local_458._M_value = 0.0;
  local_458._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&v,&local_490,&local_458,
             (allocator_type *)&output_file);
  dVar15 = __pstl::__internal::
           __pattern_transform_reduce<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,__pstl::__internal::__no_op,std::integral_constant<bool,false>>
                     (0,&__pstl::execution::v1::par,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar13 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  dVar16 = __pstl::__internal::
           __pattern_transform_reduce<__pstl::execution::v1::parallel_unsequenced_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<double>,std::multiplies<double>,std::integral_constant<bool,true>>
                     (0,&__pstl::execution::v1::par_unseq,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar14 = (long)pdVar1 - (long)pdVar13 >> 3;
  auVar19._8_4_ = (int)((long)pdVar1 - (long)pdVar13 >> 0x23);
  auVar19._0_8_ = lVar14;
  auVar19._12_4_ = 0x45300000;
  lVar6 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar20._8_4_ =
       (int)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar20._0_8_ = lVar6;
  auVar20._12_4_ = 0x45300000;
  dVar15 = dVar15 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0));
  dVar16 = dVar16 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) -
           dVar15 * dVar15;
  if (dVar16 < 0.0) {
    dVar17 = sqrt(dVar16);
  }
  else {
    dVar17 = SQRT(dVar16);
  }
  std::operator<<((ostream *)&std::cout,"mean:   ");
  poVar7 = std::ostream::_M_insert<double>(dVar15);
  std::operator<<(poVar7,'\n');
  std::operator<<((ostream *)&std::cout,"var:    ");
  poVar7 = std::ostream::_M_insert<double>(dVar16);
  std::operator<<(poVar7,'\n');
  _output_file = (element_type *)0x0;
  output_dir._M_dataplus._M_p =
       (pointer)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  output_dir._M_string_length =
       (size_type)
       v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  mkdir_command._M_dataplus._M_p = (pointer)&PTR_operator___00111b90;
  output_dir.field_2._M_allocated_capacity = (size_type)(allocator_type *)&output_file;
  mkdir_command._M_string_length = (size_type)&output_dir;
  tbb::detail::r1::isolate_within_arena((delegate_base *)&mkdir_command,0);
  peVar3 = _output_file;
  pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar13 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  std::operator<<((ostream *)&std::cout,"skew:   ");
  lVar6 = (long)pdVar1 - (long)pdVar13 >> 3;
  auVar18._8_4_ = (int)((long)pdVar1 - (long)pdVar13 >> 0x23);
  auVar18._0_8_ = lVar6;
  auVar18._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     ((double)peVar3 /
                      ((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)));
  std::operator<<(poVar7,'\n');
  lVar6 = std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector(&v2,&v);
  uVar12 = (ulong)((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) >> 1;
  __pstl::__internal::
  __pattern_nth_element<__pstl::execution::v1::parallel_policy_const&,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>,std::integral_constant<bool,false>>
            (&__pstl::execution::v1::par,
             v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar12);
  pvVar8 = std::vector<double,_std::allocator<double>_>::at(&v2,uVar12);
  dVar15 = *pvVar8;
  lVar14 = std::chrono::_V2::system_clock::now();
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 4;
  std::operator<<((ostream *)&std::cout,"median took ");
  poVar7 = std::ostream::_M_insert<double>((double)(lVar14 - lVar6) / 1000000.0);
  std::operator<<(poVar7," ms\n");
  std::operator<<((ostream *)&std::cout,"median: ");
  poVar7 = std::ostream::_M_insert<double>(dVar15);
  std::operator<<(poVar7,'\n');
  lVar14 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  lVar6 = 4;
  if (lVar14 < 4) {
    lVar6 = lVar14;
  }
  pdVar13 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  while (pdVar13 !=
         v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    lVar14 = 0;
    if (0 < lVar6) {
      lVar14 = lVar6;
    }
    bVar4 = true;
    for (lVar11 = 0; lVar14 != lVar11; lVar11 = lVar11 + 1) {
      if (50.0 < pdVar13[lVar11]) {
        bVar4 = false;
      }
    }
    if (!bVar4) break;
    pdVar13 = pdVar13 + lVar6;
    lVar10 = (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
    lVar14 = lVar6 * 2;
    lVar11 = lVar6 * -2;
    lVar6 = lVar14;
    if (SBORROW8(lVar10,lVar14) != lVar10 + lVar11 < 0) {
      lVar6 = lVar10;
    }
  }
  *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(std::cout + -0x18)) | 1;
  poVar7 = std::operator<<((ostream *)&std::cout,"Any greater than 50? ");
  poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
  std::operator<<(poVar7,'\n');
  pdVar13 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  lVar6 = 0;
  do {
    lVar14 = lVar6;
    pdVar9 = (double *)
             (lVar14 + (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
    if (pdVar9 == v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1) break;
    lVar6 = lVar14 + 8;
  } while (ABS(*pdVar9 - pdVar9[1]) < dVar17 + dVar17);
  poVar7 = std::operator<<((ostream *)&std::cout,"Position ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,", first ");
  poVar7 = std::ostream::_M_insert<double>(*(double *)((long)pdVar13 + lVar14));
  std::operator<<(poVar7," second: ");
  poVar7 = std::ostream::_M_insert<double>(*(double *)((long)pdVar13 + lVar14 + 8));
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_dir,"./output",(allocator<char> *)&output_file);
  std::operator+(&mkdir_command,"mkdir -p ",&output_dir);
  system(mkdir_command._M_dataplus._M_p);
  std::operator+(&local_4b0,&output_dir,"/results.dat");
  std::ofstream::ofstream(&output_file,(string *)&local_4b0,_S_out);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::ostream::_M_insert<double>
            (*v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  for (uVar12 = 1;
      uVar12 < (ulong)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    std::operator<<((ostream *)&output_file,',');
    std::ostream::_M_insert<double>
              (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar12]);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output_file);
  std::__cxx11::string::~string((string *)&mkdir_command);
  std::__cxx11::string::~string((string *)&output_dir);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::ifstream::~ifstream(&f);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&data_files);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(std::execution::par, v.begin(), v.end(), 0.0) / v.size();
    const double var =
        std::transform_reduce(std::execution::par_unseq, v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew =
        std::transform_reduce(std::execution::par, v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    auto half_way = v2.size() / 2;
    std::nth_element(std::execution::par, v2.begin(), std::next(v2.begin(), half_way), v2.end());
    const double median = v2.at(half_way);

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Any of the elements > 50?
    const bool any_greater_than_50 =
        std::any_of(std::execution::unseq, v.begin(), v.end(), [](const double x) { return x > 50.0; });
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    auto comparison = [std](const double x, const double y) { return std::fabs(x - y) < 2.0 * std; };
    const auto answer = std::mismatch(v.begin(), std::prev(v.end()), std::next(v.begin()), comparison);

    const auto dist = std::distance(v.begin(), answer.first);
    std::cout << "Position " << dist << ", first " << *answer.first << " second: " << *answer.second << '\n';

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}